

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Writer.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP3Writer::EndStep(BP3Writer *this)

{
  int iVar1;
  size_type sVar2;
  size_t sVar3;
  BP3Writer *in_RDI;
  size_t flushStepsCount;
  size_t currentStep;
  ScopedTimer __var294;
  IO *in_stack_00000048;
  BPSerializer *in_stack_00000050;
  BP3Writer *in_stack_000004b0;
  void *in_stack_ffffffffffffffb8;
  ScopedTimer *in_stack_ffffffffffffffc0;
  ADIOS *this_00;
  BP3Writer *in_stack_ffffffffffffffe0;
  
  if (EndStep()::__var94 == '\0') {
    iVar1 = __cxa_guard_acquire(&EndStep()::__var94);
    if (iVar1 != 0) {
      EndStep::__var94 = (void *)ps_timer_create_("BP3Writer::EndStep");
      in_stack_ffffffffffffffc0 = (ScopedTimer *)EndStep::__var94;
      __cxa_guard_release(&EndStep()::__var94);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  sVar2 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x9fd12f);
  if (sVar2 != 0) {
    PerformPuts(in_stack_000004b0);
  }
  adios2::format::BPSerializer::SerializeData(in_stack_00000050,in_stack_00000048,this._7_1_);
  sVar3 = CurrentStep(in_RDI);
  this_00 = *(ADIOS **)
             ((in_RDI->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3] + 0x200 +
             (long)&(in_RDI->m_BP3Serializer).super_BP3Base._vptr_BP3Base);
  if (sVar3 % (ulong)this_00 == 0) {
    Flush(in_stack_ffffffffffffffe0,(int)(sVar3 >> 0x20));
  }
  if (*(int *)((in_RDI->m_BP3Serializer).super_BP3Base._vptr_BP3Base[-3] + 0x10 +
              (long)&(in_RDI->m_BP3Serializer).super_BP3Base._vptr_BP3Base) == 0) {
    ADIOS::RecordOutputStep
              (this_00,(string *)in_RDI,(size_t)in_stack_ffffffffffffffc0,
               (double)in_stack_ffffffffffffffb8);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(in_stack_ffffffffffffffc0);
  return;
}

Assistant:

void BP3Writer::EndStep()
{
    PERFSTUBS_SCOPED_TIMER("BP3Writer::EndStep");
    if (m_BP3Serializer.m_DeferredVariables.size() > 0)
    {
        PerformPuts();
    }

    // true: advances step
    m_BP3Serializer.SerializeData(m_IO, true);

    const size_t currentStep = CurrentStep();
    const size_t flushStepsCount = m_BP3Serializer.m_Parameters.FlushStepsCount;

    if (currentStep % flushStepsCount == 0)
    {
        Flush();
    }

    if (m_BP3Serializer.m_RankMPI == 0)
    {
        m_IO.m_ADIOS.RecordOutputStep(m_Name, UnknownStep, UnknownTime);
    }
}